

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::fillWithGrid(PixelBufferAccess *access,int cellSize,Vec4 *colorA,Vec4 *colorB)

{
  ChannelOrder CVar1;
  ulong uVar2;
  int x;
  int z;
  Vec4 *pVVar3;
  int y_1;
  int iVar4;
  int x_1;
  int iVar5;
  PixelBufferAccess local_80;
  Vec4 local_58;
  Vec4 local_48;
  
  uVar2 = (ulong)(access->super_ConstPixelBufferAccess).m_format.type;
  if ((0x25 < uVar2) || ((0x2007000000U >> (uVar2 & 0x3f) & 1) == 0)) {
    iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
    iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    z = 0;
    if (iVar4 == 1 && iVar5 == 1) {
      for (; z < (access->super_ConstPixelBufferAccess).m_size.m_data[0]; z = z + 1) {
        pVVar3 = colorA;
        if (((long)z / (long)cellSize & 1U) != 0) {
          pVVar3 = colorB;
        }
        PixelBufferAccess::setPixel(access,pVVar3,z,0,0);
      }
      return;
    }
    if (iVar4 == 1) {
      for (; z < iVar5; z = z + 1) {
        for (iVar5 = 0; iVar5 < (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            iVar5 = iVar5 + 1) {
          pVVar3 = colorA;
          if ((int)((long)((ulong)(uint)((int)((long)iVar5 / (long)cellSize) >> 0x1f) << 0x20 |
                          (long)iVar5 / (long)cellSize & 0xffffffffU) % 2) !=
              (int)((long)((ulong)(uint)((int)((long)z / (long)cellSize) >> 0x1f) << 0x20 |
                          (long)z / (long)cellSize & 0xffffffffU) % 2)) {
            pVVar3 = colorB;
          }
          PixelBufferAccess::setPixel(access,pVVar3,iVar5,z,0);
        }
        iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
      }
      return;
    }
    for (; z < iVar4; z = z + 1) {
      for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
        for (iVar5 = 0; iVar5 < (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            iVar5 = iVar5 + 1) {
          pVVar3 = colorA;
          if (((uint)((long)((ulong)(uint)((int)((long)iVar4 / (long)cellSize) >> 0x1f) << 0x20 |
                            (long)iVar4 / (long)cellSize & 0xffffffffU) % 2) ^
              (uint)((long)((ulong)(uint)((int)((long)iVar5 / (long)cellSize) >> 0x1f) << 0x20 |
                           (long)iVar5 / (long)cellSize & 0xffffffffU) % 2)) !=
              (uint)((long)((ulong)(uint)((int)((long)z / (long)cellSize) >> 0x1f) << 0x20 |
                           (long)z / (long)cellSize & 0xffffffffU) % 2)) {
            pVVar3 = colorB;
          }
          PixelBufferAccess::setPixel(access,pVVar3,iVar5,iVar4,z);
        }
        iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
      }
      iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    }
    return;
  }
  CVar1 = (access->super_ConstPixelBufferAccess).m_format.order;
  if (CVar1 == DS) {
    getEffectiveDepthStencilAccess(&local_80,access,MODE_DEPTH);
    fillWithGrid(&local_80,cellSize,colorA,colorB);
  }
  else if (CVar1 != S) {
    if (CVar1 != D) {
      return;
    }
    getEffectiveDepthStencilAccess(&local_80,access,MODE_DEPTH);
    goto LAB_0092dc75;
  }
  getEffectiveDepthStencilAccess(&local_80,access,MODE_STENCIL);
  local_48.m_data[3] = colorA->m_data[0];
  local_48.m_data[2] = colorA->m_data[1];
  local_48.m_data[1] = colorA->m_data[2];
  local_48.m_data[0] = colorA->m_data[3];
  colorA = &local_48;
  local_58.m_data[3] = colorB->m_data[0];
  local_58.m_data[2] = colorB->m_data[1];
  local_58.m_data[1] = colorB->m_data[2];
  local_58.m_data[0] = colorB->m_data[3];
  colorB = &local_58;
LAB_0092dc75:
  fillWithGrid(&local_80,cellSize,colorA,colorB);
  return;
}

Assistant:

void fillWithGrid (const PixelBufferAccess& access, int cellSize, const Vec4& colorA, const Vec4& colorB)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), cellSize, colorA, colorB);
		if (hasStencil)
			fillWithGrid(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), cellSize, colorA.swizzle(3,2,1,0), colorB.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithGrid1D(access, cellSize, colorA, colorB);
		else if (access.getDepth() == 1)
			fillWithGrid2D(access, cellSize, colorA, colorB);
		else
			fillWithGrid3D(access, cellSize, colorA, colorB);
	}
}